

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void __thiscall
trompeloeil::list_elem<trompeloeil::call_matcher_base<float_&(float_&)>_>::~list_elem
          (list_elem<trompeloeil::call_matcher_base<float_&(float_&)>_> *this)

{
  list_elem<trompeloeil::call_matcher_base<float_&(float_&)>_> *plVar1;
  list_elem<trompeloeil::call_matcher_base<float_&(float_&)>_> *plVar2;
  
  this->_vptr_list_elem = (_func_int **)&PTR__list_elem_004f4bc0;
  plVar1 = this->next;
  plVar2 = this->prev;
  plVar1->prev = plVar2;
  plVar2->next = plVar1;
  this->next = this;
  this->prev = this;
  return;
}

Assistant:

virtual
    ~list_elem()
    {
      unlink();
    }